

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VtabArgExtend(Parse *pParse,Token *p)

{
  Token *pTVar1;
  Token *pArg;
  Token *p_local;
  Parse *pParse_local;
  
  pTVar1 = &pParse->sArg;
  if (pTVar1->z == (char *)0x0) {
    pTVar1->z = p->z;
    (pParse->sArg).n = p->n;
  }
  else {
    (pParse->sArg).n = ((int)p->z + p->n) - (int)pTVar1->z;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabArgExtend(Parse *pParse, Token *p){
  Token *pArg = &pParse->sArg;
  if( pArg->z==0 ){
    pArg->z = p->z;
    pArg->n = p->n;
  }else{
    assert(pArg->z <= p->z);
    pArg->n = (int)(&p->z[p->n] - pArg->z);
  }
}